

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
cnn::Hinge::backward_impl
          (Hinge *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float fVar1;
  uint uVar2;
  void *pvVar3;
  Scalar *pSVar4;
  uint uVar5;
  uint i_1;
  ulong index;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  if (i == 0) {
    if ((*fx->v != 0.0) || (NAN(*fx->v))) {
      fVar1 = *dEdf->v;
      uVar2 = (dEdxi->d).d[0];
      pvVar3 = (this->super_Node).aux_mem;
      uVar5 = 0;
      for (index = 0; uVar2 != index; index = index + 1) {
        if (0.0 < *(float *)((long)pvVar3 + index * 4)) {
          Tensor::operator*(&local_50,dEdxi);
          pSVar4 = Eigen::
                   DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                 *)&local_50,index);
          *pSVar4 = *pSVar4 + fVar1;
          uVar5 = uVar5 + 1;
        }
      }
      Tensor::operator*(&local_50,dEdxi);
      pSVar4 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                             *)&local_50,(ulong)*this->pelement);
      *pSVar4 = *pSVar4 - fVar1 * (float)uVar5;
    }
    return;
  }
  __assert_fail("i == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes.cc"
                ,0x4ea,
                "virtual void cnn::Hinge::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
               );
}

Assistant:

void Hinge::backward_impl(const vector<const Tensor*>& xs,
                       const Tensor& fx,
                       const Tensor& dEdf,
                       unsigned i,
                       Tensor& dEdxi) const {
  assert(i == 0);
#ifdef HAVE_CUDA
  throw std::runtime_error("Hinge not yet implemented for CUDA");
#else
  if (fx.v[0]) { // there was some loss
    const float d = dEdf.v[0];
    const unsigned rows = dEdxi.d.rows();
    const float* eloss = static_cast<const float*>(aux_mem);
    unsigned tne = 0;  // total number of errors
    for (unsigned i = 0; i < rows; ++i)
      if (eloss[i] > 0) {
        (*dEdxi)(i) += d;
        ++tne;
      }
    (*dEdxi)(*pelement) -= d * tne;
  }
#endif
}